

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O3

int set_content_encoding(IOTHUB_MESSAGE_HANDLE_DATA *handleData,char *encoding)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *tmp_encoding;
  char *local_10;
  
  iVar1 = mallocAndStrcpy_s(&local_10,encoding);
  if (iVar1 == 0) {
    if (handleData->contentEncoding != (char *)0x0) {
      free(handleData->contentEncoding);
    }
    handleData->contentEncoding = local_10;
    iVar1 = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x81;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"set_content_encoding",0x80,1,"Failed saving a copy of contentEncoding");
    }
  }
  return iVar1;
}

Assistant:

static int set_content_encoding(IOTHUB_MESSAGE_HANDLE_DATA* handleData, const char* encoding)
{
    int result;
    char* tmp_encoding;

    if (mallocAndStrcpy_s(&tmp_encoding, encoding) != 0)
    {
        LogError("Failed saving a copy of contentEncoding");
        result = MU_FAILURE;
    }
    else
    {
        if (handleData->contentEncoding != NULL)
        {
            free(handleData->contentEncoding);
        }
        handleData->contentEncoding = tmp_encoding;
        result = 0;
    }
    return result;
}